

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O0

int recvsimplehtml(SOCKET sock,char **pTitle,char **pBody,int maxrecvbuflen,int *pBytesReceived)

{
  int iVar1;
  char *local_70;
  char *bodyparams;
  char *titleparams;
  char *pcStack_58;
  int ret;
  char *content;
  char *pcStack_48;
  int contentlength;
  char *contenttype;
  char *szstatus;
  int *piStack_30;
  int status;
  int *pBytesReceived_local;
  char **ppcStack_20;
  int maxrecvbuflen_local;
  char **pBody_local;
  char **pTitle_local;
  SOCKET sock_local;
  
  szstatus._4_4_ = 0;
  contenttype = (char *)0x0;
  pcStack_48 = (char *)0x0;
  content._4_4_ = 0;
  pcStack_58 = (char *)0x0;
  titleparams._4_4_ = 0;
  bodyparams = (char *)0x0;
  local_70 = (char *)0x0;
  *pTitle = (char *)0x0;
  *pBody = (char *)0x0;
  piStack_30 = pBytesReceived;
  pBytesReceived_local._4_4_ = maxrecvbuflen;
  ppcStack_20 = pBody;
  pBody_local = pTitle;
  pTitle_local._0_4_ = sock;
  titleparams._4_4_ =
       recvsimplehttpresp(sock,(int *)((long)&szstatus + 4),&contenttype,&stack0xffffffffffffffb8,
                          (int *)((long)&content + 4),&stack0xffffffffffffffa8,maxrecvbuflen,
                          pBytesReceived);
  if (titleparams._4_4_ == 0) {
    iVar1 = strncmp(pcStack_48,"text/html",9);
    if (iVar1 == 0) {
      iVar1 = gethtmltagdata(pcStack_58,"title",&bodyparams,pBody_local);
      if (iVar1 == 0) {
        iVar1 = gethtmltagdata(pcStack_58,"body",&local_70,ppcStack_20);
        if (iVar1 == 0) {
          free(local_70);
          free(bodyparams);
          free(contenttype);
          free(pcStack_48);
          free(pcStack_58);
          pTitle_local._4_4_ = 0;
        }
        else {
          free(bodyparams);
          free(contenttype);
          free(pcStack_48);
          free(pcStack_58);
          pTitle_local._4_4_ = 1;
        }
      }
      else {
        free(contenttype);
        free(pcStack_48);
        free(pcStack_58);
        pTitle_local._4_4_ = 1;
      }
    }
    else {
      free(contenttype);
      free(pcStack_48);
      free(pcStack_58);
      pTitle_local._4_4_ = 4;
    }
  }
  else {
    free(contenttype);
    free(pcStack_48);
    free(pcStack_58);
    pTitle_local._4_4_ = titleparams._4_4_;
  }
  return pTitle_local._4_4_;
}

Assistant:

inline int recvsimplehtml(SOCKET sock, char** pTitle, char** pBody, int maxrecvbuflen, int* pBytesReceived)
{
	int status = 0;
	char* szstatus = NULL;
	char* contenttype = NULL;
	int contentlength = 0;
	char* content = NULL;
	int ret = 0;
	char* titleparams = NULL;
	char* bodyparams = NULL;

	*pTitle = NULL;
	*pBody = NULL;

	ret = recvsimplehttpresp(sock, &status, &szstatus, &contenttype, &contentlength, &content, maxrecvbuflen, pBytesReceived);
	if (ret != EXIT_SUCCESS)
	{
		free(szstatus);
		free(contenttype);
		free(content);
		return ret;
	}

	if (strncmp(contenttype, "text/html", strlen("text/html")) != 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehtml error (%s) : %s"
			"(sock=%d, title=%s, body=%s, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pTitle, *pBody, maxrecvbuflen, *pBytesReceived));
		free(szstatus);
		free(contenttype);
		free(content);
		return EXIT_INVALID_DATA;
	}

	if (gethtmltagdata(content, "title", &titleparams, pTitle) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehtml error (%s) : %s"
			"(sock=%d, title=%s, body=%s, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_FAILURE],
			(int)sock, *pTitle, *pBody, maxrecvbuflen, *pBytesReceived));
		free(szstatus);
		free(contenttype);
		free(content);
		return EXIT_FAILURE;
	}

	if (gethtmltagdata(content, "body", &bodyparams, pBody) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehtml error (%s) : %s"
			"(sock=%d, title=%s, body=%s, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_FAILURE],
			(int)sock, *pTitle, *pBody, maxrecvbuflen, *pBytesReceived));
		free(titleparams);
		free(szstatus);
		free(contenttype);
		free(content);
		return EXIT_FAILURE;
	}

	free(bodyparams);
	free(titleparams);

	free(szstatus);
	free(contenttype);
	free(content);
	
	return EXIT_SUCCESS;
}